

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::AllocatePage(PF_BufferMgr *this,int fd,PageNum pageNum,char **ppBuffer)

{
  PF_BufPageDesc *pPVar1;
  RC RVar2;
  undefined8 in_RAX;
  long lVar3;
  int slot;
  
  slot = (int)((ulong)in_RAX >> 0x20);
  RVar2 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&slot);
  if (RVar2 == -8) {
    RVar2 = InternalAlloc(this,&slot);
    if (RVar2 == 0) {
      RVar2 = PF_HashTable::Insert(&this->hashTable,fd,pageNum,slot);
      lVar3 = (long)slot;
      if (RVar2 == 0) {
        pPVar1 = this->bufTable;
        pPVar1[lVar3].fd = fd;
        pPVar1[lVar3].pageNum = pageNum;
        pPVar1[lVar3].bDirty = 0;
        pPVar1[lVar3].pinCount = 1;
        *ppBuffer = pPVar1[slot].pData;
        RVar2 = 0;
      }
      else {
        Unlink(this,slot);
        this->bufTable[slot].next = this->free;
        this->free = slot;
      }
    }
  }
  else if (RVar2 == 0) {
    RVar2 = -7;
  }
  return RVar2;
}

Assistant:

RC PF_BufferMgr::AllocatePage(int fd, PageNum pageNum, char **ppBuffer)
{
   RC  rc;     // return code
   int slot;   // buffer slot where page is located

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Allocating a page for (%d,%d)....", fd, pageNum);
   WriteLog(psMessage);
#endif

   // If page is already in buffer, return an error
   if (!(rc = hashTable.Find(fd, pageNum, slot)))
      return (PF_PAGEINBUF);
   else if (rc != PF_HASHNOTFOUND)
      return (rc);              // unexpected error

   // Allocate an empty page
   if ((rc = InternalAlloc(slot)))
      return (rc);

   // Insert the page into the hash table,
   // and initialize the page description entry
   if ((rc = hashTable.Insert(fd, pageNum, slot)) ||
         (rc = InitPageDesc(fd, pageNum, slot))) {

      // Put the slot back on the free list before returning the error
      Unlink(slot);
      InsertFree(slot);
      return (rc);
   }

#ifdef PF_LOG
   WriteLog("Succesfully allocated page.\n");
#endif

   // Point ppBuffer to page
   *ppBuffer = bufTable[slot].pData;

   // Return ok
   return (0);
}